

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O0

void __thiscall
QUrlPrivate::setUserInfo<QStringView>(QUrlPrivate *this,QStringView *value,ParsingMode mode)

{
  qsizetype qVar1;
  undefined4 in_EDX;
  QUrlPrivate *in_RSI;
  QStringView *in_RDI;
  long in_FS_OFFSET;
  qsizetype delimIndex;
  undefined4 in_stack_ffffffffffffff98;
  ParsingMode in_stack_ffffffffffffff9c;
  QStringView *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  QUrlPrivate *this_00;
  undefined1 in_stack_ffffffffffffffd0 [16];
  QChar c;
  QChar local_a;
  long local_8;
  
  c.ucs = in_stack_ffffffffffffffd0._14_2_;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RSI;
  QChar::QChar<char16_t,_true>(&local_a,L':');
  qVar1 = QStringView::indexOf
                    (in_stack_ffffffffffffffb0,c,(qsizetype)in_RSI,
                     (CaseSensitivity)((ulong)in_RDI >> 0x20));
  if (qVar1 < 0) {
    setUserName<QStringView>(in_RSI,in_RDI,in_stack_ffffffffffffff9c);
    QString::clear((QString *)in_RDI);
    *(byte *)&in_RDI[0xb].m_data = *(byte *)&in_RDI[0xb].m_data & 0xfb;
  }
  else {
    QStringView::first((QStringView *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                       0x309b03);
    setUserName<QStringView>(in_RSI,in_RDI,in_stack_ffffffffffffff9c);
    QStringView::sliced((QStringView *)this_00,CONCAT44(in_EDX,in_stack_ffffffffffffffb8));
    setPassword<QStringView>(in_RSI,in_RDI,in_stack_ffffffffffffff9c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QUrlPrivate::setUserInfo(String &&value, QUrl::ParsingMode mode)
{
    Q_ASSERT_X(mode != QUrl::DecodedMode, "setUserInfo",
               "This function should only be called when parsing encoded components");
    qsizetype delimIndex = value.indexOf(u':');
    if (delimIndex < 0) {
        // no password
        setUserName(std::move(value), mode);
        password.clear();
        sectionIsPresent &= ~Password;
    } else {
        setUserName(value.first(delimIndex), mode);
        setPassword(value.sliced(delimIndex + 1), mode);
    }
}